

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcards.cpp
# Opt level: O3

int Wildcard::set(char **wildcard,char **test)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  char *pcVar6;
  char cVar7;
  bool bVar8;
  
  pcVar6 = *wildcard;
  cVar2 = *pcVar6;
  cVar7 = cVar2;
  if (cVar2 == '!') {
    *wildcard = pcVar6 + 1;
    pcVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
    cVar7 = *pcVar1;
  }
  bVar8 = false;
  bVar5 = 0;
  do {
    if (bVar8 == false) {
      if (cVar7 == '-') {
        cVar3 = pcVar6[-1];
        cVar4 = pcVar6[1];
        if (!(bool)(~bVar5 & 1 | cVar4 == ']' | cVar4 <= cVar3)) {
          cVar7 = **test;
          bVar8 = cVar7 <= cVar4 && cVar3 <= cVar7;
          if (cVar7 <= cVar4 && cVar3 <= cVar7) {
            pcVar6 = pcVar6 + 1;
          }
          goto LAB_00271527;
        }
      }
      bVar8 = cVar7 == **test;
    }
    else {
      bVar8 = true;
    }
LAB_00271527:
    *wildcard = pcVar6 + 1;
    cVar7 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
    bVar5 = 1;
    if (cVar7 == ']') {
      if (bVar8 != (cVar2 == '!')) {
        *test = *test + 1;
      }
      return (int)(byte)(bVar8 ^ cVar2 == '!');
    }
  } while( true );
}

Assistant:

int Wildcard::set(const char** wildcard, const char** test) {
  int fit          = 0;
  int negation     = 0;
  int at_beginning = 1;

  if ('!' == **wildcard) {
    negation = 1;
    (*wildcard)++;
  }
  while ((']' != **wildcard) || (1 == at_beginning)) {
    if (0 == fit) {
      if (('-' == **wildcard) && ((*(*wildcard - 1)) < (*(*wildcard + 1))) &&
          (']' != *(*wildcard + 1)) && (0 == at_beginning)) {
        if (((**test) >= (*(*wildcard - 1))) &&
            ((**test) <= (*(*wildcard + 1)))) {
          fit = 1;
          (*wildcard)++;
        }
      } else if ((**wildcard) == (**test)) {
        fit = 1;
      }
    }
    (*wildcard)++;
    at_beginning = 0;
  }
  if (1 == negation) /* change from zero to one and vice versa */
    fit = 1 - fit;
  if (1 == fit) (*test)++;

  return (fit);
}